

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Collection.cpp
# Opt level: O0

bool doVisit<(arangodb::velocypack::Collection::VisitationOrder)2>
               (Slice slice,
               function<bool_(arangodb::velocypack::Slice,_arangodb::velocypack::Slice)> *func)

{
  bool bVar1;
  char *msg;
  function<bool_(arangodb::velocypack::Slice,_arangodb::velocypack::Slice)> *in_stack_00000030;
  Slice in_stack_00000038;
  undefined8 in_stack_ffffffffffffffd8;
  ExceptionType type;
  Exception *in_stack_ffffffffffffffe0;
  bool local_1;
  
  type = (ExceptionType)((ulong)in_stack_ffffffffffffffd8 >> 0x20);
  bVar1 = arangodb::velocypack::SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>
          ::isObject((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)0x124138
                    );
  if (bVar1) {
    local_1 = visitObject<(arangodb::velocypack::Collection::VisitationOrder)2>
                        (in_stack_00000038,in_stack_00000030);
  }
  else {
    bVar1 = arangodb::velocypack::
            SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::isArray
                      ((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)
                       0x124169);
    if (!bVar1) {
      msg = (char *)__cxa_allocate_exception(0x18);
      arangodb::velocypack::Exception::Exception(in_stack_ffffffffffffffe0,type,msg);
      __cxa_throw(msg,&arangodb::velocypack::Exception::typeinfo,
                  arangodb::velocypack::Exception::~Exception);
    }
    local_1 = visitArray<(arangodb::velocypack::Collection::VisitationOrder)2>
                        (in_stack_00000038,in_stack_00000030);
  }
  return local_1;
}

Assistant:

static bool doVisit(
    Slice slice,
    std::function<bool(Slice key, Slice value)> const& func) {
  if (slice.isObject()) {
    return visitObject<order>(slice, func);
  }
  if (slice.isArray()) {
    return visitArray<order>(slice, func);
  }

  throw Exception(Exception::InvalidValueType,
                  "Expecting type Object or Array");
}